

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::LogMessage::LogMessage
          (LogMessage *this,Level level,string *file,LineNumber line,string *func,
          VerboseLevel verboseLevel,Logger *logger)

{
  undefined8 in_RCX;
  string *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  string *in_R8;
  undefined2 in_R9W;
  Logger *in_stack_00000008;
  
  *in_RDI = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  *(undefined8 *)(in_RDI + 10) = in_RCX;
  std::__cxx11::string::string((string *)(in_RDI + 0xc),in_R8);
  *(undefined2 *)(in_RDI + 0x14) = in_R9W;
  *(Logger **)(in_RDI + 0x16) = in_stack_00000008;
  Logger::stream_abi_cxx11_(in_stack_00000008);
  std::__cxx11::stringstream::str();
  return;
}

Assistant:

LogMessage(Level level, const std::string& file, base::type::LineNumber line, const std::string& func,
             base::type::VerboseLevel verboseLevel, Logger* logger) :
    m_level(level), m_file(file), m_line(line), m_func(func),
    m_verboseLevel(verboseLevel), m_logger(logger), m_message(logger->stream().str()) {
  }